

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int opt_max_background_threads_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  size_t *in_RCX;
  ulong *in_R8;
  long in_R9;
  long in_stack_00000008;
  size_t copylen;
  size_t oldval;
  int ret;
  size_t local_50;
  size_t local_40;
  int local_34;
  
  if ((in_R9 == 0) && (in_stack_00000008 == 0)) {
    local_40 = opt_max_background_threads;
    if ((in_RCX != (size_t *)0x0) && (in_R8 != (ulong *)0x0)) {
      if (*in_R8 != 8) {
        if (*in_R8 < 8) {
          local_50 = *in_R8;
        }
        else {
          local_50 = 8;
        }
        memcpy(in_RCX,&local_40,local_50);
        return 0x16;
      }
      *in_RCX = opt_max_background_threads;
    }
    local_34 = 0;
  }
  else {
    local_34 = 1;
  }
  return local_34;
}

Assistant:

static int
max_background_threads_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	size_t oldval;

	if (!have_background_thread) {
		return ENOENT;
	}
	background_thread_ctl_init(tsd_tsdn(tsd));

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	malloc_mutex_lock(tsd_tsdn(tsd), &background_thread_lock);
	if (newp == NULL) {
		oldval = max_background_threads;
		READ(oldval, size_t);
	} else {
		if (newlen != sizeof(size_t)) {
			ret = EINVAL;
			goto label_return;
		}
		oldval = max_background_threads;
		READ(oldval, size_t);

		size_t newval = *(size_t *)newp;
		if (newval == oldval) {
			ret = 0;
			goto label_return;
		}
		if (newval > opt_max_background_threads) {
			ret = EINVAL;
			goto label_return;
		}

		if (background_thread_enabled()) {
			background_thread_enabled_set(tsd_tsdn(tsd), false);
			if (background_threads_disable(tsd)) {
				ret = EFAULT;
				goto label_return;
			}
			max_background_threads = newval;
			background_thread_enabled_set(tsd_tsdn(tsd), true);
			if (background_threads_enable(tsd)) {
				ret = EFAULT;
				goto label_return;
			}
		} else {
			max_background_threads = newval;
		}
	}
	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &background_thread_lock);
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);

	return ret;
}